

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  char **ppcVar1;
  bool bVar2;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  MemoryMappedFile file;
  allocator local_59;
  string local_58;
  char **local_38;
  char **err_local;
  char *filename_local;
  EXRVersion *exr_version_local;
  int *num_headers_local;
  EXRHeader ***exr_headers_local;
  
  local_38 = err;
  err_local = (char **)filename;
  filename_local = (char *)exr_version;
  exr_version_local = (EXRVersion *)num_headers;
  num_headers_local = (int *)exr_headers;
  if ((((exr_headers == (EXRHeader ***)0x0) || (num_headers == (int *)0x0)) ||
      (exr_version == (EXRVersion *)0x0)) || (filename == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,"Invalid argument for ParseEXRMultipartHeaderFromFile()",
               &local_59);
    tinyexr::SetErrorMessage(&local_58,local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    exr_headers_local._4_4_ = -3;
  }
  else {
    MemoryMappedFile::MemoryMappedFile((MemoryMappedFile *)local_88,filename);
    bVar2 = MemoryMappedFile::valid((MemoryMappedFile *)local_88);
    ppcVar1 = err_local;
    if (bVar2) {
      exr_headers_local._4_4_ =
           ParseEXRMultipartHeaderFromMemory
                     ((EXRHeader ***)num_headers_local,&exr_version_local->version,
                      (EXRVersion *)filename_local,(uchar *)local_88,(size_t)file.data,local_38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,(char *)ppcVar1,&local_c9);
      std::operator+(&local_a8,"Cannot read file ",&local_c8);
      tinyexr::SetErrorMessage(&local_a8,local_38);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      exr_headers_local._4_4_ = -7;
    }
    MemoryMappedFile::~MemoryMappedFile((MemoryMappedFile *)local_88);
  }
  return exr_headers_local._4_4_;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromFile()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  MemoryMappedFile file(filename);
  if (!file.valid()) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  return ParseEXRMultipartHeaderFromMemory(
      exr_headers, num_headers, exr_version, file.data, file.size, err);
}